

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O3

void build_obmc_prediction
               (MACROBLOCKD *xd,int rel_mi_row,int rel_mi_col,uint8_t op_mi_size,int dir,
               MB_MODE_INFO *above_mbmi,void *fun_ctxt,int num_planes)

{
  BLOCK_SIZE bsize;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint8_t *puVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  scale_factors *sf;
  uint uVar12;
  int x;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  buf_2d *pbVar16;
  
  iVar8 = xd->mi_row;
  iVar1 = xd->mi_col;
  if (0 < num_planes) {
    uVar12._0_1_ = above_mbmi->bsize;
    uVar12._1_1_ = above_mbmi->partition;
    uVar12._2_1_ = above_mbmi->mode;
    uVar12._3_1_ = above_mbmi->uv_mode;
    uVar9 = 3;
    if (3 < (byte)(undefined1)uVar12) {
      uVar9 = (ulong)uVar12;
    }
    lVar14 = *(long *)((long)fun_ctxt + 8);
    lVar5 = *(long *)((long)fun_ctxt + 0x10);
    lVar10 = *(long *)((long)fun_ctxt + 0x18);
    lVar6 = *(long *)((long)fun_ctxt + 0x20);
    piVar11 = &xd->plane[0].dst.stride;
    uVar15 = 0;
    do {
      puVar7 = *(uint8_t **)(lVar14 + uVar15 * 8);
      uVar12 = (uint)((0x20005UL >> (uVar9 & 0x3f) & 1) != 0);
      if (piVar11[-8] == 0) {
        uVar12 = 0;
      }
      uVar13 = (uint)((0x10003UL >> (uVar9 & 0x3f) & 1) != 0);
      if (piVar11[-9] == 0) {
        uVar13 = 0;
      }
      iVar2 = *(int *)(lVar5 + uVar15 * 4);
      iVar3 = *(int *)(lVar6 + uVar15 * 4);
      iVar4 = *(int *)(lVar10 + uVar15 * 4);
      ((buf_2d *)(piVar11 + -6))->buf =
           puVar7 + (long)((int)((~uVar12 & rel_mi_row) << 2) >> ((byte)piVar11[-8] & 0x1f)) *
                    (long)iVar3 +
                    (long)((int)((~uVar13 & rel_mi_col) << 2) >> ((byte)piVar11[-9] & 0x1f));
      *(uint8_t **)(piVar11 + -4) = puVar7;
      piVar11[-2] = iVar2;
      piVar11[-1] = iVar4;
      *piVar11 = iVar3;
      uVar15 = uVar15 + 1;
      piVar11 = piVar11 + 0x28c;
    } while ((uint)num_planes != uVar15);
  }
  if ((byte)(above_mbmi->ref_frame[0] - 1U) < 8) {
    lVar5 = *fun_ctxt;
    iVar2 = *(int *)(lVar5 + 0xf0 + (ulong)((byte)above_mbmi->ref_frame[0] - 1) * 4);
    if (iVar2 == -1) {
      lVar10 = -1;
      lVar14 = 0;
    }
    else {
      lVar10 = (long)iVar2;
      lVar14 = *(long *)(lVar5 + 0x1a0 + lVar10 * 8);
    }
    sf = (scale_factors *)0x0;
    if (iVar2 != -1) {
      sf = (scale_factors *)(lVar5 + 0x120 + lVar10 * 0x10);
    }
  }
  else {
    lVar14 = 0;
    sf = (scale_factors *)0x0;
  }
  xd->block_ref_scale_factors[0] = sf;
  if ((sf->x_scale_fp == -1) || (sf->y_scale_fp == -1)) {
    aom_internal_error(xd->error_info,AOM_CODEC_UNSUP_BITSTREAM,
                       "Reference frame has invalid dimensions");
  }
  av1_setup_pre_planes
            (xd,0,(YV12_BUFFER_CONFIG *)(lVar14 + 0x4e0),iVar8 + rel_mi_row,iVar1 + rel_mi_col,sf,
             num_planes);
  if (0 < num_planes) {
    bsize = (*xd->mi)->bsize;
    pbVar16 = xd->plane[0].pre;
    uVar9 = 0;
    do {
      iVar8 = av1_skip_u4x4_pred_in_obmc
                        (bsize,(macroblockd_plane *)((long)(pbVar16 + -2) + 0x10),dir);
      if (iVar8 == 0) {
        build_one_inter_predictor
                  (pbVar16[-1].buf,pbVar16[-1].stride,(MV *)(ulong)above_mbmi->mv[0].as_int,
                   (InterPredParams *)(ulong)(above_mbmi->mv[0].as_int >> 0x10));
      }
      uVar9 = uVar9 + 1;
      pbVar16 = (buf_2d *)((long)(pbVar16 + 0x51) + 0x10);
    } while ((uint)num_planes != uVar9);
  }
  return;
}

Assistant:

static inline void build_obmc_prediction(MACROBLOCKD *xd, int rel_mi_row,
                                         int rel_mi_col, uint8_t op_mi_size,
                                         int dir, MB_MODE_INFO *above_mbmi,
                                         void *fun_ctxt, const int num_planes) {
  struct build_prediction_ctxt *ctxt = (struct build_prediction_ctxt *)fun_ctxt;
  setup_address_for_obmc(xd, rel_mi_row, rel_mi_col, above_mbmi, ctxt,
                         num_planes);

  const int mi_x = (xd->mi_col + rel_mi_col) << MI_SIZE_LOG2;
  const int mi_y = (xd->mi_row + rel_mi_row) << MI_SIZE_LOG2;

  const BLOCK_SIZE bsize = xd->mi[0]->bsize;

  InterPredParams inter_pred_params;

  for (int j = 0; j < num_planes; ++j) {
    const struct macroblockd_plane *pd = &xd->plane[j];
    int bw = 0, bh = 0;

    if (dir) {
      // prepare left reference block size
      bw = clamp(block_size_wide[bsize] >> (pd->subsampling_x + 1), 4,
                 block_size_wide[BLOCK_64X64] >> (pd->subsampling_x + 1));
      bh = (op_mi_size << MI_SIZE_LOG2) >> pd->subsampling_y;
    } else {
      // prepare above reference block size
      bw = (op_mi_size * MI_SIZE) >> pd->subsampling_x;
      bh = clamp(block_size_high[bsize] >> (pd->subsampling_y + 1), 4,
                 block_size_high[BLOCK_64X64] >> (pd->subsampling_y + 1));
    }

    if (av1_skip_u4x4_pred_in_obmc(bsize, pd, dir)) continue;

    const struct buf_2d *const pre_buf = &pd->pre[0];
    const MV mv = above_mbmi->mv[0].as_mv;

    av1_init_inter_params(&inter_pred_params, bw, bh, mi_y >> pd->subsampling_y,
                          mi_x >> pd->subsampling_x, pd->subsampling_x,
                          pd->subsampling_y, xd->bd, is_cur_buf_hbd(xd), 0,
                          xd->block_ref_scale_factors[0], pre_buf,
                          above_mbmi->interp_filters);
    inter_pred_params.conv_params = get_conv_params(0, j, xd->bd);

    av1_enc_build_one_inter_predictor(pd->dst.buf, pd->dst.stride, &mv,
                                      &inter_pred_params);
  }
}